

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Multiply_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  Type TVar7;
  double dVar8;
  Type TStack_50;
  double local_38;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x3b5,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) goto LAB_009932b8;
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x3b6,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) goto LAB_009932b8;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x3b7,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_009932b8;
    *puVar4 = 0;
  }
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_009932b8;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    TVar7 = TypeIds_FirstNumberType;
  }
  else if (aLeft < (Var)0x4000000000000) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_009932b8;
      *puVar4 = 0;
    }
    TVar7 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_009932b8;
      *puVar4 = 0;
    }
  }
  else {
    TVar7 = TypeIds_Number;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_009932b8;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aRight);
  if (bVar2) {
    TStack_50 = TypeIds_FirstNumberType;
  }
  else if (aRight < (Var)0x4000000000000) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_009932b8;
      *puVar4 = 0;
    }
    TStack_50 = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)TStack_50) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_009932b8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    TStack_50 = TypeIds_Number;
  }
  if ((TVar7 == TypeIds_BigInt) || (TStack_50 == TypeIds_BigInt)) {
    if (TStack_50 != TVar7) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
    }
    pvVar6 = JavascriptBigInt::Mul(aLeft,aRight);
    return pvVar6;
  }
  if ((Var)0x3ffffffffffff < aLeft) {
    if (aRight < (Var)0x4000000000000) {
      bVar2 = TaggedInt::Is(aRight);
      if (!bVar2) goto LAB_00993294;
      local_38 = (double)(int)aRight;
    }
    else {
      local_38 = JavascriptNumber::GetValue(aLeft);
      aLeft = aRight;
    }
LAB_0099324c:
    dVar8 = JavascriptNumber::GetValue(aLeft);
    pvVar6 = JavascriptNumber::ToVarNoCheck(dVar8 * local_38,scriptContext);
    return pvVar6;
  }
  if (aRight < (Var)0x4000000000000) {
    bVar2 = TaggedInt::IsPair(aLeft,aRight);
    if (bVar2) {
      pvVar6 = TaggedInt::Multiply(aLeft,aRight,scriptContext);
      return pvVar6;
    }
  }
  else {
    bVar2 = TaggedInt::Is(aLeft);
    if (bVar2) {
      local_38 = (double)(int)aLeft;
      aLeft = aRight;
      goto LAB_0099324c;
    }
  }
LAB_00993294:
  dVar8 = Multiply_Helper(aLeft,aRight,scriptContext);
  pvVar6 = JavascriptNumber::ToVarIntCheck(dVar8,scriptContext);
  return pvVar6;
}

Assistant:

Var JavascriptMath::Multiply_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Multiply_Full);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Multiply BigInt"));
                }
                return JavascriptBigInt::Mul(aLeft, aRight);
            }

            if(JavascriptNumber::Is(aLeft))
            {
                if(JavascriptNumber::Is(aRight))
                {
                    double product = JavascriptNumber::GetValue(aLeft) * JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::ToVarNoCheck(product, scriptContext);
                }
                else if(TaggedInt::Is(aRight))
                {
                    double product = TaggedInt::ToDouble(aRight) * JavascriptNumber::GetValue(aLeft);
                    return JavascriptNumber::ToVarNoCheck(product, scriptContext);
                }
            }
            else if(JavascriptNumber::Is(aRight))
            {
                if(TaggedInt::Is(aLeft))
                {
                    double product = TaggedInt::ToDouble(aLeft) * JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::ToVarNoCheck(product, scriptContext);
                }
            }
            else if(TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Multiply(aLeft, aRight, scriptContext);
            }
            double product = Multiply_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(product, scriptContext);
            JIT_HELPER_END(Op_Multiply_Full);
        }